

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O1

void __thiscall
soul::heart::Printer::PrinterStream::printValue(soul::Value_const&)::Printer::
printStringLiteral(choc::value::StringDictionary::Handle_(void *this,Handle h)

{
  long *plVar1;
  char cVar2;
  char cVar3;
  char *in_RCX;
  uint uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  string_view s;
  string __str;
  string local_38;
  
  uVar5 = (ulong)h.handle;
  plVar1 = *(long **)((long)this + 8);
  if (plVar1 == (long *)0x0) {
    cVar3 = '\x01';
    if (9 < h.handle) {
      cVar2 = '\x04';
      do {
        cVar3 = cVar2;
        uVar4 = (uint)uVar5;
        if (uVar4 < 100) {
          cVar3 = cVar3 + -2;
          goto LAB_00260cfb;
        }
        if (uVar4 < 1000) {
          cVar3 = cVar3 + -1;
          goto LAB_00260cfb;
        }
        if (uVar4 < 10000) goto LAB_00260cfb;
        uVar5 = uVar5 / 10000;
        cVar2 = cVar3 + '\x04';
      } while (99999 < uVar4);
      cVar3 = cVar3 + '\x01';
    }
LAB_00260cfb:
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_38,cVar3);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_38._M_dataplus._M_p,(uint)local_38._M_string_length,h.handle);
  }
  else {
    auVar6 = (**(code **)(*plVar1 + 0x18))(plVar1,uVar5);
    s._M_len = auVar6._8_8_;
    s._M_str = in_RCX;
    choc::json::getEscapedQuotedString_abi_cxx11_(&local_38,auVar6._0_8_,s);
  }
  (**(code **)(*this + 0x98))
            (this,CONCAT44(local_38._M_string_length._4_4_,(uint)local_38._M_string_length),
             local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void printStringLiteral (StringDictionary::Handle h) override
                {
                    print (dictionary != nullptr ? toHeartStringLiteral (dictionary->getStringForHandle (h))
                                                 : std::to_string (h.handle));
                }